

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# planck_unit.c
# Opt level: O1

void planck_unit_add_to_suite
               (planck_unit_suite_t *suite,planck_unit_test_func_t test_func,char *func_name,
               char *file)

{
  planck_unit_test_t *ppVar1;
  planck_unit_test_t **pppVar2;
  planck_unit_test_t **pppVar3;
  
  ppVar1 = (planck_unit_test_t *)malloc(0x50);
  if (ppVar1 != (planck_unit_test_t *)0x0) {
    ppVar1->test_func = test_func;
    ppVar1->next = (planck_unit_test_t *)0x0;
    ppVar1->suite = suite;
    ppVar1->allocated_message = '\0';
    ppVar1->func_name = func_name;
    ppVar1->line = -1;
    ppVar1->file = file;
    ppVar1->message = "";
    ppVar1->result = '\x01';
    ppVar1->base_name = func_name;
    pppVar3 = &suite->tail;
    if (suite->head == (planck_unit_test_t *)0x0) {
      pppVar2 = &suite->head;
    }
    else {
      pppVar2 = pppVar3;
      pppVar3 = &(*pppVar3)->next;
    }
    *pppVar3 = ppVar1;
    *pppVar2 = ppVar1;
    return;
  }
  puts("out of memory");
  fflush(_stdout);
  exit(-1);
}

Assistant:

void
planck_unit_add_to_suite(
	planck_unit_suite_t		*suite,
	planck_unit_test_func_t test_func,
	char *func_name,
	const char			*file
) {
	planck_unit_test_t *next;

	next = malloc(sizeof(planck_unit_test_t));

	if (NULL == next) {
		PLANCK_UNIT_PRINT_STR("out of memory\n");
		exit(-1);
	}

	next->test_func			= test_func;
	next->next				= NULL;
	next->suite				= suite;
	next->allocated_message = 0;
	next->func_name			= func_name;
	next->line				= -1;
	next->file				= file;
	next->message			= "";
	next->result			= PLANCK_UNIT_SUCCESS;
	next->base_name			= func_name;

	if (NULL == suite->head) {
		suite->tail = next;
		suite->head = next;
	}
	else {
		suite->tail->next	= next;
		suite->tail			= next;
	}
}